

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_row_fillHashCache
               (ZSTD_matchState_t *ms,BYTE *base,U32 rowLog,U32 mls,U32 idx,BYTE *iLimit)

{
  U32 UVar1;
  size_t sVar2;
  U32 h;
  BYTE *p;
  uint local_90;
  uint local_88;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  U16 *tagTable;
  U32 *hashTable;
  BYTE *iLimit_local;
  U32 idx_local;
  U32 mls_local;
  U32 rowLog_local;
  BYTE *base_local;
  ZSTD_matchState_t *ms_local;
  U32 local_28;
  
  UVar1 = ms->rowHashLog;
  if (iLimit < base + idx) {
    local_88 = 0;
  }
  else {
    local_88 = ((int)iLimit - ((int)base + idx)) + 1;
  }
  if (local_88 < 9) {
    local_90 = local_88;
  }
  else {
    local_90 = 8;
  }
  for (iLimit_local._4_4_ = idx; iLimit_local._4_4_ < idx + local_90;
      iLimit_local._4_4_ = iLimit_local._4_4_ + 1) {
    p = base + iLimit_local._4_4_;
    h = UVar1 + 8;
    switch(mls) {
    default:
      sVar2 = ZSTD_hash4Ptr(p,h);
      local_28 = (U32)sVar2;
      break;
    case 5:
      sVar2 = ZSTD_hash5Ptr(p,h);
      local_28 = (U32)sVar2;
      break;
    case 6:
      sVar2 = ZSTD_hash6Ptr(p,h);
      local_28 = (U32)sVar2;
      break;
    case 7:
      sVar2 = ZSTD_hash7Ptr(p,h);
      local_28 = (U32)sVar2;
      break;
    case 8:
      sVar2 = ZSTD_hash8Ptr(p,h);
      local_28 = (U32)sVar2;
    }
    ms->hashCache[iLimit_local._4_4_ & 7] = local_28;
  }
  return;
}

Assistant:

static void ZSTD_row_fillHashCache(ZSTD_matchState_t* ms, const BYTE* base,
                                   U32 const rowLog, U32 const mls,
                                   U32 idx, const BYTE* const iLimit)
{
    U32 const* const hashTable = ms->hashTable;
    U16 const* const tagTable = ms->tagTable;
    U32 const hashLog = ms->rowHashLog;
    U32 const maxElemsToPrefetch = (base + idx) > iLimit ? 0 : (U32)(iLimit - (base + idx) + 1);
    U32 const lim = idx + MIN(ZSTD_ROW_HASH_CACHE_SIZE, maxElemsToPrefetch);

    for (; idx < lim; ++idx) {
        U32 const hash = (U32)ZSTD_hashPtr(base + idx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls);
        U32 const row = (hash >> ZSTD_ROW_HASH_TAG_BITS) << rowLog;
        ZSTD_row_prefetch(hashTable, tagTable, row, rowLog);
        ms->hashCache[idx & ZSTD_ROW_HASH_CACHE_MASK] = hash;
    }

    DEBUGLOG(6, "ZSTD_row_fillHashCache(): [%u %u %u %u %u %u %u %u]", ms->hashCache[0], ms->hashCache[1],
                                                     ms->hashCache[2], ms->hashCache[3], ms->hashCache[4],
                                                     ms->hashCache[5], ms->hashCache[6], ms->hashCache[7]);
}